

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sender3F1S.cpp
# Opt level: O2

void * flow_thread(void *thread_args)

{
  SenderFlow *this;
  ulong __n;
  int iVar1;
  FILE *__stream;
  void *__ptr;
  undefined8 uVar2;
  void *__buf;
  long lVar3;
  ulong uVar4;
  FILE *__n_00;
  uint uVar5;
  int in_R8D;
  double dVar6;
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  char errmsg [32];
  string filename;
  
  this = *thread_args;
  std::__cxx11::string::string((string *)&filename,(string *)((long)thread_args + 8));
  __n = *(ulong *)((long)thread_args + 0x28);
  __stream = fopen(filename._M_dataplus._M_p,"r");
  if (__stream == (FILE *)0x0) {
    sprintf(errmsg,"fopen(\"%s\")",filename._M_dataplus._M_p);
    perror(errmsg);
    fclose((FILE *)0x0);
    std::__cxx11::string::~string((string *)&filename);
    return (void *)0x0;
  }
  __ptr = operator_new__(__n);
  uVar2 = zmq_stopwatch_start();
  uVar5 = 0;
  while( true ) {
    iVar1 = feof(__stream);
    if (iVar1 != 0) break;
    __n_00 = __stream;
    __buf = (void *)fread(__ptr,1,__n,__stream);
    SenderFlow::send(this,(int)__ptr,__buf,(size_t)__n_00,in_R8D);
    uVar5 = uVar5 + 1;
  }
  operator_delete__(__ptr);
  lVar3 = zmq_stopwatch_stop(uVar2);
  lVar3 = lVar3 + (ulong)(lVar3 == 0);
  SenderFlow::name_abi_cxx11_((string *)errmsg,this);
  printf("%s. message size: %d [B]\n",errmsg._0_8_,__n & 0xffffffff);
  std::__cxx11::string::~string((string *)errmsg);
  SenderFlow::name_abi_cxx11_((string *)errmsg,this);
  printf("%s. message count: %d\n",errmsg._0_8_,(ulong)uVar5);
  std::__cxx11::string::~string((string *)errmsg);
  SenderFlow::name_abi_cxx11_((string *)errmsg,this);
  auVar7._8_4_ = (int)((ulong)lVar3 >> 0x20);
  auVar7._0_8_ = lVar3;
  auVar7._12_4_ = 0x45300000;
  dVar6 = ((double)(int)uVar5 /
          ((auVar7._8_8_ - 1.9342813113834067e+25) +
          ((double)CONCAT44(0x43300000,(int)lVar3) - 4503599627370496.0))) * 1000000.0;
  uVar4 = (ulong)dVar6;
  uVar4 = (long)(dVar6 - 9.223372036854776e+18) & (long)uVar4 >> 0x3f | uVar4;
  printf("%s. mean throughput: %d [msg/s]\n",errmsg._0_8_,uVar4 & 0xffffffff);
  std::__cxx11::string::~string((string *)errmsg);
  SenderFlow::name_abi_cxx11_((string *)errmsg,this);
  lVar3 = __n * uVar4 * 8;
  auVar8._8_4_ = (int)((ulong)lVar3 >> 0x20);
  auVar8._0_8_ = lVar3;
  auVar8._12_4_ = 0x45300000;
  printf("%s. mean throughput: %.3f [Mb/s]\n",
         ((auVar8._8_8_ - 1.9342813113834067e+25) +
         ((double)CONCAT44(0x43300000,(int)lVar3) - 4503599627370496.0)) / 1000000.0,errmsg._0_8_);
  uVar2 = std::__cxx11::string::~string((string *)errmsg);
  fclose((FILE *)errmsg);
  std::__cxx11::string::~string((string *)&filename);
  _Unwind_Resume(uVar2);
}

Assistant:

void *flow_thread(void *thread_args)
{
    int message_count = 0;
    unsigned long elapsed;
    unsigned long throughput;
    double megabits;

    // Get thread arguments
    struct flow_thread_args *args = (struct flow_thread_args*)thread_args;
    SenderFlow *sf = args->flow;
    std::string filename = args->filename;
    size_t buffsize = args->buffsize;

    FILE *file __attribute__((cleanup (__raii_file))) =
        fopen(filename.c_str(), "r");
    if (file == NULL) {
        char errmsg[32];
        sprintf(errmsg, "fopen(\"%s\")", filename.c_str());
        perror(errmsg);
        return NULL;
    }

    char *buffer = new char[buffsize];
    void *watch = zmq_stopwatch_start();

    while (!feof(file)) {
        size_t read = fread(buffer, 1, buffsize, file);
        sf->send(buffer, read);
        message_count++;
    }
    delete[] buffer;

    elapsed = zmq_stopwatch_stop (watch);
    if (elapsed == 0)
        elapsed = 1;

    size_t message_size = buffsize;
    throughput = (unsigned long) ((double) message_count / (double) elapsed * 1000000);
    megabits = (double) (throughput * message_size * 8) / 1000000;

    printf ("%s. message size: %d [B]\n", sf->name().c_str(), (int) message_size);
    printf ("%s. message count: %d\n", sf->name().c_str(), (int) message_count);
    printf ("%s. mean throughput: %d [msg/s]\n", sf->name().c_str(), (int) throughput);
    printf ("%s. mean throughput: %.3f [Mb/s]\n", sf->name().c_str(), (double) megabits);
}